

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O2

void RigidBodyDynamics::ForwardDynamicsAccelerationDeltas
               (Model *model,ConstraintSet *CS,VectorNd *QDDot_t,uint body_id,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_t)

{
  double dVar1;
  int iVar2;
  int iVar3;
  JointType JVar4;
  uint uVar5;
  pointer ppCVar6;
  pointer pJVar7;
  CustomJoint *pCVar8;
  double *pdVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  XprTypeNested pMVar13;
  long lVar14;
  Matrix<double,_6,_1,_0,_6,_1> *dst;
  LhsNested pMVar15;
  XprTypeNested pMVar16;
  long lVar17;
  SpatialTransform *pSVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  ResScalar RVar22;
  undefined1 local_148 [16];
  LhsNested local_138;
  scalar_constant_op<double> local_130;
  LhsNested local_110;
  long local_108;
  VectorNd *local_100;
  long local_f8;
  long local_f0;
  Vector3d qdd_temp;
  long local_b8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
  local_b0;
  SpatialVector Xa;
  
  uVar10 = 0;
  local_100 = QDDot_t;
  while( true ) {
    uVar11 = (ulong)uVar10;
    if ((ulong)(((long)(model->mBodies).
                       super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x70) <= uVar11) break;
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
               (*(long *)(CS + 0x580) + uVar11 * 0x30));
    Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
               (uVar11 * 0x30 + *(long *)(CS + 0x598)));
    *(undefined8 *)(*(long *)(CS + 0x5b0) + uVar11 * 8) = 0;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               (uVar11 * 0x18 + *(long *)(CS + 0x600)));
    uVar10 = uVar10 + 1;
  }
  uVar10 = 0;
  while( true ) {
    ppCVar6 = (model->mCustomJoints).
              super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(model->mCustomJoints).
                      super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar6 >> 3) <=
        (ulong)uVar10) break;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(ppCVar6[uVar10] + 200));
    uVar10 = uVar10 + 1;
  }
  uVar11 = (ulong)body_id;
  lVar20 = uVar11 * 0x30;
  lVar17 = uVar11 * 0x18;
  local_f0 = uVar11 * 0x90;
  pMVar15 = (LhsNested)(uVar11 * 4);
  local_f8 = uVar11 * 0x60;
  local_b8 = uVar11 * 0x48;
  local_108 = lVar20;
  for (lVar19 = 0; lVar21 = lVar20 + lVar19, lVar21 != 0; lVar19 = lVar19 + -0x30) {
    if (lVar19 == 0) {
      Math::SpatialTransform::applyAdjoint
                (&Xa,(model->X_base).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar11,
                 (SpatialVector *)
                 ((long)&(((f_t->
                           super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                           ).
                           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_Matrix<double,_6,_1,_0,_6,_1>).
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar20));
      local_148._0_8_ = (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&Xa;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>>
                ((Matrix<double,_6,_1,_0,_6,_1> *)(*(long *)(CS + 0x580) + lVar20),
                 (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                  *)local_148);
    }
    pJVar7 = (model->mJoints).
             super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             .
             super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar2 = *(int *)((long)&pJVar7->mJointType + lVar17);
    iVar3 = *(int *)((long)&pJVar7->mDoFCount + lVar17);
    if (iVar3 == 1) {
      if (iVar2 == 0x15) goto LAB_00205267;
      RVar22 = Eigen::internal::
               dot_nocheck<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_false>
               ::run((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                     ((long)&(((model->S).
                               super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                               .
                               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_Matrix<double,_6,_1,_0,_6,_1>).
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                     lVar19 + lVar20),
                     (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                     (*(long *)(CS + 0x580) + lVar20 + lVar19));
      *(double *)(*(long *)(CS + 0x5b0) + (long)pMVar15 * 2) = -RVar22;
      uVar12 = (ulong)*(uint *)((long)(pMVar15->
                                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                                      m_storage.m_data.array +
                               (long)(model->lambda).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
      if (uVar12 == 0) goto LAB_002053b1;
      lVar20 = uVar12 * 0x30;
      local_110 = (LhsNested)(*(long *)(CS + 0x580) + lVar20);
      pSVar18 = (SpatialTransform *)
                ((long)&(((model->X_lambda).
                          super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                          .
                          super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                          ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d + local_f8);
      Xa.super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
           (double)(lVar21 + *(long *)(CS + 0x580));
      Xa.super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
           (double)((long)&(((model->U).
                             super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                             .
                             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_Matrix<double,_6,_1,_0,_6,_1>).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> +
                   lVar19 + local_108);
      Xa.super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
           -RVar22;
      Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
      _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&qdd_temp,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>_>
                  *)&Xa);
      Math::SpatialTransform::applyTranspose(pSVar18,(SpatialVector *)&qdd_temp);
      local_b0.m_lhs = local_110;
      dst = (Matrix<double,_6,_1,_0,_6,_1> *)(lVar20 + *(long *)(CS + 0x580));
      local_b0.m_rhs = (RhsNested)local_148;
LAB_0020539f:
      lVar20 = local_108;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
                (dst,&local_b0);
    }
    else {
      if (iVar3 == 3) {
        if (iVar2 == 0x15) {
LAB_00205267:
          uVar10 = *(uint *)((long)&pJVar7->custom_joint_index + lVar17);
          ppCVar6 = (model->mCustomJoints).
                    super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          Xa.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
               (double)(ppCVar6[uVar10] + 0x70);
          Xa.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
               (double)(*(long *)(CS + 0x580) + lVar20 + lVar19);
          Eigen::internal::
          call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>const>,Eigen::Matrix<double,6,1,0,6,1>,0>>
                    ((Matrix<double,__1,_1,_0,__1,_1> *)(ppCVar6[uVar10] + 200),
                     (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
                      *)&Xa);
          uVar12 = (ulong)*(uint *)((long)(pMVar15->
                                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                          ).m_storage.m_data.array +
                                   (long)(model->lambda).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
          if (uVar12 == 0) goto LAB_002053b1;
          lVar20 = *(long *)(CS + 0x580);
          lVar14 = uVar12 * 0x30;
          pSVar18 = (SpatialTransform *)
                    ((long)&(((model->X_lambda).
                              super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                              .
                              super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                              ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d +
                    local_f8);
          qdd_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[0] = (double)(lVar21 + lVar20);
          pCVar8 = (model->mCustomJoints).
                   super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar10];
          qdd_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[1] = (double)(pCVar8 + 0x88);
          qdd_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[2] = (double)(pCVar8 + 0xa0);
          local_110 = pMVar15;
          Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
          _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)local_148,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                      *)&qdd_temp);
          Math::SpatialTransform::applyTranspose(pSVar18,(SpatialVector *)local_148);
          dst = (Matrix<double,_6,_1,_0,_6,_1> *)(lVar14 + *(long *)(CS + 0x580));
          local_b0.m_lhs = (LhsNested)(lVar20 + lVar14);
        }
        else {
          Xa.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
               (double)((long)&(((model->multdof3_S).
                                 super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                 .
                                 super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                               m_storage + local_f0);
          Xa.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
               (double)(*(long *)(CS + 0x580) + lVar20 + lVar19);
          Eigen::internal::
          call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>const>,Eigen::Matrix<double,6,1,0,6,1>,0>>
                    ((Matrix<double,_3,_1,_0,_3,_1> *)(*(long *)(CS + 0x600) + lVar17),
                     (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>
                      *)&Xa);
          uVar12 = (ulong)*(uint *)((long)(pMVar15->
                                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                                          ).m_storage.m_data.array +
                                   (long)(model->lambda).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
          if (uVar12 == 0) goto LAB_002053b1;
          lVar20 = *(long *)(CS + 0x580);
          lVar14 = uVar12 * 0x30;
          pSVar18 = (SpatialTransform *)
                    ((long)&(((model->X_lambda).
                              super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                              .
                              super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                              ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d +
                    local_f8);
          qdd_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[0] = (double)(lVar21 + lVar20);
          qdd_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[1] =
               (double)((long)&(((model->multdof3_U).
                                 super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                 .
                                 super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                               m_storage + local_f0);
          qdd_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data.array[2] =
               (double)((long)&(((model->multdof3_Dinv).
                                 super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
                                 super__Vector_impl_data._M_start)->super_Matrix3d).
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                               m_storage + local_b8);
          local_110 = pMVar15;
          Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
          _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)local_148,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                      *)&qdd_temp);
          Math::SpatialTransform::applyTranspose(pSVar18,(SpatialVector *)local_148);
          dst = (Matrix<double,_6,_1,_0,_6,_1> *)(lVar14 + *(long *)(CS + 0x580));
          local_b0.m_lhs = (LhsNested)(lVar20 + lVar14);
        }
        local_b0.m_rhs = &Xa.super_Matrix<double,_6,_1,_0,_6,_1>;
        pMVar15 = local_110;
        goto LAB_0020539f;
      }
      if (iVar2 == 0x15) goto LAB_00205267;
    }
LAB_002053b1:
    lVar17 = lVar17 + -0x18;
    local_f0 = local_f0 + -0x90;
    pMVar15 = (LhsNested)
              ((long)pMVar15[-1].super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                     m_storage.m_data.array + 0x2c);
    local_f8 = local_f8 + -0x60;
    local_b8 = local_b8 + -0x48;
  }
  *(local_100->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
       0.0;
  Eigen::internal::call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::Matrix<double,6,1,0,6,1>>
            (*(Matrix<double,_6,_1,_0,_6,_1> **)(CS + 0x598),
             &((model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
               _M_impl.super__Vector_impl_data._M_start)->super_Matrix<double,_6,_1,_0,_6,_1>);
  uVar11 = 1;
  do {
    if ((ulong)(((long)(model->mBodies).
                       super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                       .
                       super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x70) <= uVar11) {
      return;
    }
    uVar10 = (model->mJoints).
             super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             .
             super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar11].q_index;
    Math::SpatialTransform::apply
              ((model->X_lambda).
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar11,
               (SpatialVector *)
               ((ulong)(model->lambda).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar11] * 0x30 + *(long *)(CS + 0x598)));
    pJVar7 = (model->mJoints).
             super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             .
             super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    JVar4 = pJVar7[uVar11].mJointType;
    if (pJVar7[uVar11].mDoFCount == 1) {
      if (JVar4 == JointTypeCustom) goto LAB_0020562f;
      dVar1 = *(double *)(*(long *)(CS + 0x5b0) + uVar11 * 8);
      RVar22 = Eigen::internal::
               dot_nocheck<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_false>
               ::run((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                     ((model->U).
                      super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                      super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar11),
                     (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&Xa);
      local_130.m_other =
           (dVar1 - RVar22) /
           (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data[uVar11];
      (local_100->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      [uVar10] = local_130.m_other;
      local_148._8_8_ =
           (model->S).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
           super__Vector_impl_data._M_start + uVar11;
      local_148._0_8_ = (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&Xa;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const>const>>
                ((Matrix<double,_6,_1,_0,_6,_1> *)(uVar11 * 0x30 + *(long *)(CS + 0x598)),
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>_>
                  *)local_148);
    }
    else if (pJVar7[uVar11].mDoFCount == 3) {
      if (JVar4 == JointTypeCustom) {
LAB_0020562f:
        uVar5 = pJVar7[uVar11].custom_joint_index;
        pMVar16 = (XprTypeNested)
                  (ulong)*(uint *)((model->mCustomJoints).
                                   super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar5] + 8);
        local_138.m_matrix = (non_const_type)0x0;
        local_148._0_8_ = pMVar16;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&qdd_temp,
                   (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)local_148);
        pCVar8 = (model->mCustomJoints).
                 super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar5];
        local_148._0_8_ = pCVar8 + 0xa0;
        local_148._8_8_ = pCVar8 + 200;
        local_138.m_matrix = (non_const_type)(pCVar8 + 0x88);
        local_130.m_other = (double)&Xa;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>,0>>
                  ((Matrix<double,__1,_1,_0,__1,_1> *)&qdd_temp,
                   (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_0>
                    *)local_148);
        pdVar9 = (local_100->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        for (pMVar13 = (XprTypeNested)0x0; pMVar16 != pMVar13;
            pMVar13 = (XprTypeNested)
                      ((long)(pMVar13->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>)
                             .m_storage.m_data.array + 1)) {
          pdVar9[uVar10 + (int)pMVar13] =
               *(double *)
                ((long)qdd_temp.super_Vector3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array[0] + (long)pMVar13 * 8);
        }
        local_148._0_8_ =
             (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start + uVar11;
        local_148._8_8_ =
             (model->mCustomJoints).
             super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar5] + 0x70;
        local_138.m_matrix = (non_const_type)&qdd_temp;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
                  ((Matrix<double,_6,_1,_0,_6,_1> *)local_148._0_8_,
                   (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                    *)local_148);
        local_148._8_8_ =
             (model->mCustomJoints).
             super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar5] + 0x70;
        local_148._0_8_ = &Xa;
        local_138.m_matrix = (non_const_type)&qdd_temp;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
                  ((Matrix<double,_6,_1,_0,_6,_1> *)(uVar11 * 0x30 + *(long *)(CS + 0x598)),
                   (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                    *)local_148);
        free((void *)qdd_temp.super_Vector3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array[0]);
      }
      else {
        local_148._0_8_ =
             (model->multdof3_Dinv).super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>.
             _M_impl.super__Vector_impl_data._M_start + uVar11;
        local_148._8_8_ = uVar11 * 0x18 + *(long *)(CS + 0x600);
        local_138.m_matrix =
             (non_const_type)
             ((model->multdof3_U).
              super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
              .
              super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar11);
        local_130.m_other = (double)&Xa;
        Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
        _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>,0>>
                  ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&qdd_temp,
                   (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_0>_>
                    *)local_148);
        pdVar9 = (local_100->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        pdVar9[uVar10] =
             qdd_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[0];
        pdVar9[uVar10 + 1] =
             qdd_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[1];
        pdVar9[uVar10 + 2] =
             qdd_temp.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[2];
        local_148._0_8_ =
             (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl
             .super__Vector_impl_data._M_start + uVar11;
        local_148._8_8_ =
             (model->multdof3_S).
             super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar11;
        local_138.m_matrix = (non_const_type)&qdd_temp;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
                  ((Matrix<double,_6,_1,_0,_6,_1> *)local_148._0_8_,
                   (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                    *)local_148);
        local_148._8_8_ =
             (model->multdof3_S).
             super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar11;
        local_148._0_8_ = &Xa;
        local_138.m_matrix = (non_const_type)&qdd_temp;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
                  ((Matrix<double,_6,_1,_0,_6,_1> *)(uVar11 * 0x30 + *(long *)(CS + 0x598)),
                   (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                    *)local_148);
      }
    }
    else if (JVar4 == JointTypeCustom) goto LAB_0020562f;
    uVar11 = (ulong)((int)uVar11 + 1);
  } while( true );
}

Assistant:

RBDL_DLLAPI
void ForwardDynamicsAccelerationDeltas (
  Model &model,
  ConstraintSet &CS,
  VectorNd &QDDot_t,
  const unsigned int body_id,
  const std::vector<SpatialVector> &f_t
)
{
  LOG << "-------- " << __func__ << " ------" << std::endl;

  assert (CS.d_pA.size() == model.mBodies.size());
  assert (CS.d_a.size() == model.mBodies.size());
  assert (CS.d_u.size() == model.mBodies.size());

  // TODO reset all values (debug)
  for (unsigned int i = 0; i < model.mBodies.size(); i++) {
    CS.d_pA[i].setZero();
    CS.d_a[i].setZero();
    CS.d_u[i] = 0.;
    CS.d_multdof3_u[i].setZero();
  }
  for(unsigned int i=0; i<model.mCustomJoints.size(); i++) {
    model.mCustomJoints[i]->d_u.setZero();
  }

  for (unsigned int i = body_id; i > 0; i--) {
    if (i == body_id) {
      CS.d_pA[i] = -model.X_base[i].applyAdjoint(f_t[i]);
    }

    if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {
      CS.d_multdof3_u[i] = - model.multdof3_S[i].transpose() * (CS.d_pA[i]);

      unsigned int lambda = model.lambda[i];
      if (lambda != 0) {
        CS.d_pA[lambda] =   CS.d_pA[lambda]
                            + model.X_lambda[i].applyTranspose (
                              CS.d_pA[i] + (model.multdof3_U[i]
                                            * model.multdof3_Dinv[i]
                                            * CS.d_multdof3_u[i]));
      }
    } else if(model.mJoints[i].mDoFCount == 1
              && model.mJoints[i].mJointType != JointTypeCustom) {
      CS.d_u[i] = - model.S[i].dot(CS.d_pA[i]);
      unsigned int lambda = model.lambda[i];

      if (lambda != 0) {
        CS.d_pA[lambda] = CS.d_pA[lambda]
                          + model.X_lambda[i].applyTranspose (
                            CS.d_pA[i] + model.U[i] * CS.d_u[i] / model.d[i]);
      }
    } else if (model.mJoints[i].mJointType == JointTypeCustom) {

      unsigned int kI     = model.mJoints[i].custom_joint_index;
      unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;
      //CS.
      model.mCustomJoints[kI]->d_u =
        - model.mCustomJoints[kI]->S.transpose() * (CS.d_pA[i]);
      unsigned int lambda = model.lambda[i];
      if (lambda != 0) {
        CS.d_pA[lambda] =
          CS.d_pA[lambda]
          + model.X_lambda[i].applyTranspose (
            CS.d_pA[i] + (   model.mCustomJoints[kI]->U
                             * model.mCustomJoints[kI]->Dinv
                             * model.mCustomJoints[kI]->d_u)
          );
      }
    }
  }

  for (unsigned int i = 0; i < f_t.size(); i++) {
    LOG << "f_t[" << i << "] = " << f_t[i].transpose() << std::endl;
  }

  for (unsigned int i = 0; i < model.mBodies.size(); i++) {
    LOG << "i = " << i << ": d_pA[i] " << CS.d_pA[i].transpose() << std::endl;
  }
  for (unsigned int i = 0; i < model.mBodies.size(); i++) {
    LOG << "i = " << i << ": d_u[i] = " << CS.d_u[i] << std::endl;
  }

  QDDot_t[0] = 0.;
  CS.d_a[0] = model.a[0];

  for (unsigned int i = 1; i < model.mBodies.size(); i++) {
    unsigned int q_index = model.mJoints[i].q_index;
    unsigned int lambda = model.lambda[i];

    SpatialVector Xa = model.X_lambda[i].apply(CS.d_a[lambda]);

    if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {
      Vector3d qdd_temp = model.multdof3_Dinv[i]
                          * (CS.d_multdof3_u[i] - model.multdof3_U[i].transpose() * Xa);

      QDDot_t[q_index] = qdd_temp[0];
      QDDot_t[q_index + 1] = qdd_temp[1];
      QDDot_t[q_index + 2] = qdd_temp[2];
      model.a[i] = model.a[i] + model.multdof3_S[i] * qdd_temp;
      CS.d_a[i] = Xa + model.multdof3_S[i] * qdd_temp;
    } else if (model.mJoints[i].mDoFCount == 1
               && model.mJoints[i].mJointType != JointTypeCustom) {

      QDDot_t[q_index] = (CS.d_u[i] - model.U[i].dot(Xa) ) / model.d[i];
      CS.d_a[i] = Xa + model.S[i] * QDDot_t[q_index];
    } else if (model.mJoints[i].mJointType == JointTypeCustom) {
      unsigned int kI     = model.mJoints[i].custom_joint_index;
      unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;
      VectorNd qdd_temp = VectorNd::Zero(dofI);

      qdd_temp = model.mCustomJoints[kI]->Dinv
                 * (model.mCustomJoints[kI]->d_u
                    - model.mCustomJoints[kI]->U.transpose() * Xa);

      for(int z=0; z<dofI; ++z) {
        QDDot_t[q_index+z] = qdd_temp[z];
      }

      model.a[i] = model.a[i] + model.mCustomJoints[kI]->S * qdd_temp;
      CS.d_a[i] = Xa + model.mCustomJoints[kI]->S * qdd_temp;
    }

    LOG << "QDDot_t[" << i - 1 << "] = " << QDDot_t[i - 1] << std::endl;
    LOG << "d_a[i] = " << CS.d_a[i].transpose() << std::endl;
  }
}